

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptimeutilities.h
# Opt level: O2

void __thiscall jrtplib::RTPTime::RTPTime(RTPTime *this,RTPNTPTime ntptime)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (0x83aa7e7f < ntptime.msw) {
    dVar1 = (double)((long)((double)((ulong)ntptime >> 0x20) * 2.3283064365386963e-10 * 1000000.0) &
                    0xffffffff) * 1e-06 + (double)(int)(ntptime.msw + 0x7c558180);
  }
  this->m_t = dVar1;
  return;
}

Assistant:

inline RTPTime::RTPTime(RTPNTPTime ntptime)
{
	if (ntptime.GetMSW() < RTP_NTPTIMEOFFSET)
	{
		m_t = 0;
	}
	else
	{
		uint32_t sec = ntptime.GetMSW() - RTP_NTPTIMEOFFSET;
		
		double x = (double)ntptime.GetLSW();
		x /= (65536.0*65536.0);
		x *= 1000000.0;
		uint32_t microsec = (uint32_t)x;

		m_t = (double)sec + 1e-6*(double)microsec;
	}
}